

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::ScopedMessage::~ScopedMessage(ScopedMessage *this)

{
  bool bVar1;
  IResultCapture *pIVar2;
  
  bVar1 = uncaught_exceptions();
  if ((!bVar1) && (this->m_moved == false)) {
    pIVar2 = getResultCapture();
    (*pIVar2->_vptr_IResultCapture[0xb])(pIVar2,this);
  }
  std::__cxx11::string::~string((string *)&(this->m_info).message);
  return;
}

Assistant:

ScopedMessage::~ScopedMessage() {
        if (!uncaught_exceptions() && !m_moved) {
            getResultCapture().popScopedMessage(m_info);
        }
    }